

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.h
# Opt level: O2

object_task<crnlib::qdxt1> * __thiscall
crnlib::
crnlib_new<crnlib::object_task<crnlib::qdxt1>,crnlib::qdxt1*,void(crnlib::qdxt1::*)(unsigned_long_long,void*),crnlib::object_task_flags>
          (crnlib *this,qdxt1 **init0,offset_in_qdxt1_to_subr *init1,object_task_flags *init2)

{
  qdxt1 *pqVar1;
  qdxt1 *pqVar2;
  qdxt1 *pqVar3;
  offset_in_qdxt1_to_subr oVar4;
  object_task<crnlib::qdxt1> *poVar5;
  
  poVar5 = (object_task<crnlib::qdxt1> *)crnlib_malloc(0x28);
  pqVar1 = *(qdxt1 **)this;
  oVar4 = *init1;
  (poVar5->super_executable_task)._vptr_executable_task = (_func_int **)&PTR_execute_task_001b9538;
  pqVar2 = *init0;
  pqVar3 = init0[1];
  poVar5->m_pObject = pqVar1;
  poVar5->m_pMethod = (object_method_ptr)pqVar2;
  *(qdxt1 **)&poVar5->field_0x18 = pqVar3;
  poVar5->m_flags = (uint)oVar4;
  return poVar5;
}

Assistant:

inline T* crnlib_new(const A& init0, const B& init1, const C& init2)
    {
        T* p = static_cast<T*>(crnlib_malloc(sizeof(T)));
        return new (static_cast<void*>(p)) T(init0, init1, init2);
    }